

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall tchecker::syncprod::system_t::compute_labels(system_t *this)

{
  index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *this_00;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  pointer pdVar1;
  locations_identifiers_range_t lVar2;
  pointer pbVar3;
  pointer psVar4;
  bool bVar5;
  label_id_t lVar6;
  locations_identifiers_range_t lVar7;
  size_t sVar8;
  string *l_1;
  pointer pbVar9;
  loc_id_t id;
  locs_t *this_02;
  string *l;
  ulong uVar10;
  allocator<char> local_a1;
  locations_identifiers_range_t local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  integer_iterator_t<unsigned_int> local_70;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  local_68;
  pointer local_58;
  pointer local_38;
  
  this_02 = &(this->super_system_t).super_locs_t;
  local_a0 = (locations_identifiers_range_t)this;
  lVar7 = tchecker::system::locs_t::locations_identifiers(this_02);
  labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar10 = (ulong)lVar7 & 0xffffffff;
      pbVar3 = labels.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, local_70 = lVar7._end._current,
      id = (loc_id_t)this_02, local_70._current != (int)uVar10; uVar10 = (ulong)((int)uVar10 + 1)) {
    tchecker::system::locs_t::location((locs_t *)&stack0xffffffffffffffa8,id);
    psVar4 = local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"labels",&local_a1);
    local_68 = tchecker::system::attributes_t::range
                         ((attributes_t *)
                          &psVar4[2].
                           super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(string *)&stack0xffffffffffffffa8);
    labels_from_attrs(&local_68,&labels);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  this_00 = (index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)((long)local_a0 + 0x348);
  for (pbVar9 = labels.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1) {
    bVar5 = labels_t::is_label((labels_t *)this_00,pbVar9);
    if (!bVar5) {
      labels_t::add_label((labels_t *)this_00,pbVar9);
    }
  }
  sVar8 = index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          ::size(this_00);
  lVar2 = local_a0;
  this_01 = (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)((long)local_a0 + 0x3c8);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_01,*(long *)((long)lVar2 + 0x238) - *(long *)((long)lVar2 + 0x230) >> 4);
  local_38 = (pointer)(sVar8 & 0xffffffff);
  while (lVar7._begin._current._current != local_70._current) {
    uVar10 = (ulong)lVar7 & 0xffffffff;
    local_a0 = lVar7;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((this_01->
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar10,(size_type)local_38,false);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
              ((this_01->
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar10);
    tchecker::system::locs_t::location((locs_t *)&stack0xffffffffffffffa8,id);
    psVar4 = local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&labels);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"labels",&local_a1);
    local_68 = tchecker::system::attributes_t::range
                         ((attributes_t *)
                          &psVar4[2].
                           super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(string *)&stack0xffffffffffffffa8);
    labels_from_attrs(&local_68,&labels);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    pbVar3 = labels.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1)
    {
      pdVar1 = (this_01->
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = labels_t::label_id((labels_t *)this_00,pbVar9);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (pdVar1 + uVar10,(ulong)lVar6,true);
    }
    lVar7._begin._current = local_a0._begin._current._current + 1;
    lVar7._end._current = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&labels);
  return;
}

Assistant:

void system_t::compute_labels()
{
  tchecker::system::locs_t::locations_identifiers_range_t const locations_identifiers = this->locations_identifiers();

  // Compute labels index
  std::vector<std::string> labels;
  for (tchecker::loc_id_t const loc_id : locations_identifiers) {
    auto const & attr = tchecker::syncprod::system_t::location(loc_id)->attributes();
    labels_from_attrs(attr.range("labels"), labels);
  }

  for (std::string const & l : labels) {
    if (!tchecker::syncprod::labels_t::is_label(l))
      tchecker::syncprod::labels_t::add_label(l);
  }

  // Set location labels
  tchecker::label_id_t const & labels_count = this->labels_count();

  _labels.clear();
  _labels.resize(this->locations_count());

  for (tchecker::loc_id_t const loc_id : locations_identifiers) {
    _labels[loc_id].resize(labels_count);
    _labels[loc_id].reset();
    auto const & attr = tchecker::syncprod::system_t::location(loc_id)->attributes();
    labels.clear();
    labels_from_attrs(attr.range("labels"), labels);
    for (std::string const & l : labels)
      _labels[loc_id].set(this->label_id(l));
  }
}